

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_lib_shutdown(void)

{
  if (sUnqlMPGlobal.nMagic == 0xea1495ba) {
    unqliteCoreShutdown();
  }
  return 0;
}

Assistant:

int unqlite_lib_shutdown(void)
{
	if( sUnqlMPGlobal.nMagic != UNQLITE_LIB_MAGIC ){
		/* Already shut */
		return UNQLITE_OK;
	}
	unqliteCoreShutdown();
	return UNQLITE_OK;
}